

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

void __thiscall
cfd::core::Serializer::AddPrefixBuffer
          (Serializer *this,uint64_t prefix,uint8_t *buffer,uint32_t buffer_size)

{
  int iVar1;
  
  if (prefix < 0xfd) {
    iVar1 = 1;
  }
  else if (prefix < 0x10000) {
    iVar1 = 3;
  }
  else {
    iVar1 = (uint)(prefix >> 0x20 != 0) * 4 + 5;
  }
  AddVariableInt(this,(ulong)(iVar1 + buffer_size));
  AddVariableInt(this,prefix);
  AddDirectBytes(this,buffer,buffer_size);
  return;
}

Assistant:

void Serializer::AddPrefixBuffer(
    uint64_t prefix, const uint8_t* buffer, uint32_t buffer_size) {
  uint32_t size = GetVariableIntSize(prefix) + buffer_size;
  AddVariableInt(size);
  AddVariableInt(prefix);
  AddDirectBytes(buffer, buffer_size);
}